

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TagExtracter::~TagExtracter(TagExtracter *this)

{
  TagExtracter *this_local;
  
  ~TagExtracter(this);
  operator_delete(this);
  return;
}

Assistant:

TagExtracter::~TagExtracter() {}